

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  string *psVar1;
  Nonnull<const_char_*> failure_msg;
  int line;
  Arena *rhs_arena;
  Arena *lhs_arena;
  Arena *local_58;
  Arena *local_50;
  uint local_44;
  LogMessageFatal local_40;
  
  local_50 = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)local_50 & 1) != 0) {
    local_50 = *(Arena **)((ulong)local_50 & 0xfffffffffffffffe);
  }
  local_58 = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)local_58 & 1) != 0) {
    local_58 = *(Arena **)((ulong)local_58 & 0xfffffffffffffffe);
  }
  psVar1 = (string *)
           Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>(r,lhs,field);
  Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>(r,rhs,field);
  local_40.super_LogMessage.errno_saver_.saved_errno_ =
       ReflectionSchema::InlinedStringIndex(&r->schema_,field);
  local_44 = 0;
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                          ((uint *)&local_40,&local_44,"index > 0u");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    Reflection::MutableInlinedStringDonatedArray(r,lhs);
    Reflection::MutableInlinedStringDonatedArray(r,rhs);
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                            (&local_50,&local_58,"lhs_arena == rhs_arena");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      std::__cxx11::string::swap(psVar1);
      return;
    }
    line = 0x2c0;
  }
  else {
    line = 0x2b7;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  uint32_t index = r->schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  uint32_t* lhs_array = r->MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = r->MutableInlinedStringDonatedArray(rhs);
  uint32_t* lhs_state = &lhs_array[index / 32];
  uint32_t* rhs_state = &rhs_array[index / 32];
  bool lhs_arena_dtor_registered = (lhs_array[0] & 0x1u) == 0;
  bool rhs_arena_dtor_registered = (rhs_array[0] & 0x1u) == 0;
  const uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
  if (unsafe_shallow_swap) {
    ABSL_DCHECK_EQ(lhs_arena, rhs_arena);
    InlinedStringField::InternalSwap(lhs_string, lhs_arena_dtor_registered, lhs,
                                     rhs_string, rhs_arena_dtor_registered, rhs,
                                     lhs_arena);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask,
                    lhs);
    rhs_string->Set(temp, rhs_arena, r->IsInlinedStringDonated(*rhs, field),
                    rhs_state, mask, rhs);
  }
}